

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::ComputeWingedEdges
          (ChTriangleMeshConnected *this,
          map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          *winged_edges,bool allow_single_wing)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer pCVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  _Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_> fedge;
  _Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_> _Var9;
  _Rb_tree_node_base *p_Var10;
  ulong uVar11;
  undefined7 in_register_00000011;
  bool bVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>_>
  pVar18;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_98;
  undefined4 local_84;
  _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,std::pair<int,int>>,std::_Select1st<std::pair<std::pair<int,int>const,std::pair<int,int>>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
  *local_80;
  ChTriangleMeshConnected *local_78;
  long local_70;
  ulong local_68;
  multimap<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  edge_map;
  
  edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &edge_map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_84 = (undefined4)CONCAT71(in_register_00000011,allow_single_wing);
  edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  edge_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar13 = 8;
  local_80 = (_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,std::pair<int,int>>,std::_Select1st<std::pair<std::pair<int,int>const,std::pair<int,int>>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
              *)winged_edges;
  local_78 = this;
  edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar16 = 0;
      pCVar4 = (local_78->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
      p_Var10 = edge_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      uVar16 < (ulong)(((long)(local_78->m_face_v_indices).
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) / 0xc);
      uVar16 = uVar16 + 1) {
    iVar1 = *(int *)((long)pCVar4->m_data + lVar13 + -8);
    iVar15 = *(int *)((long)pCVar4->m_data + lVar13 + -4);
    iVar2 = *(int *)((long)pCVar4->m_data + lVar13);
    iVar5 = iVar15;
    if (iVar1 < iVar15) {
      iVar5 = iVar1;
    }
    iVar6 = iVar15;
    if (iVar15 < iVar1) {
      iVar6 = iVar1;
    }
    iVar7 = iVar1;
    if (iVar2 < iVar1) {
      iVar7 = iVar2;
    }
    if (iVar1 < iVar2) {
      iVar1 = iVar2;
    }
    local_98.first.second = iVar6;
    local_98.first.first = iVar5;
    local_70 = lVar13;
    local_68 = uVar16;
    local_98.second.first = (int)uVar16;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
    ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                *)&edge_map,(pair<const_std::pair<int,_int>,_int> *)&local_98);
    uVar16 = local_68;
    iVar5 = iVar2;
    if (iVar2 < iVar15) {
      iVar5 = iVar15;
    }
    if (iVar15 < iVar2) {
      iVar2 = iVar15;
    }
    local_98.first.second = iVar5;
    local_98.first.first = iVar2;
    iVar15 = (int)local_68;
    local_98.second.first = iVar15;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
    ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                *)&edge_map,(pair<const_std::pair<int,_int>,_int> *)&local_98);
    local_98.first.second = iVar1;
    local_98.first.first = iVar7;
    local_98.second.first = iVar15;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
    ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
              ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                *)&edge_map,(pair<const_std::pair<int,_int>,_int> *)&local_98);
    lVar13 = local_70 + 0xc;
  }
  do {
    if ((_Rb_tree_header *)p_Var10 == &edge_map._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
      ::~_Rb_tree(&edge_map._M_t);
      return false;
    }
    pVar18 = std::
             _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
             ::equal_range(&edge_map._M_t,(key_type *)(p_Var10 + 1));
    _Var9 = pVar18.first._M_node;
    bVar12 = true;
    uVar14 = 0;
    uVar17 = 0;
    uVar16 = 0xffffffffffffffff;
    bVar8 = false;
    while ((_Var9._M_node != pVar18.second._M_node._M_node &&
           (uVar3 = *(uint *)&_Var9._M_node[1]._M_parent, uVar3 != 0xffffffff))) {
      uVar17 = (ulong)_Var9._M_node[1]._M_color;
      uVar14 = (ulong)*(uint *)&_Var9._M_node[1].field_0x4;
      uVar16 = uVar16 & 0xffffffff;
      if (bVar12) {
        uVar16 = (ulong)uVar3;
      }
      if (bVar8) {
        uVar11 = (ulong)uVar3 << 0x20;
        goto LAB_00d59e93;
      }
      _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
      bVar8 = true;
      bVar12 = false;
    }
    uVar11 = 0xffffffff00000000;
    if (((byte)local_84 & bVar8) != 0) {
LAB_00d59e93:
      local_98.first = (pair<int,_int>)(uVar17 | uVar14 << 0x20);
      local_98.second = (pair<int,_int>)(uVar16 & 0xffffffff | uVar11);
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,std::pair<int,int>>,std::_Select1st<std::pair<std::pair<int,int>const,std::pair<int,int>>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
      ::_M_emplace_unique<std::pair<std::pair<int,int>,std::pair<int,int>>>(local_80,&local_98);
      *(undefined4 *)&p_Var10[1]._M_parent = 0xffffffff;
    }
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
  } while( true );
}

Assistant:

bool ChTriangleMeshConnected::ComputeWingedEdges(std::map<std::pair<int, int>, std::pair<int, int>>& winged_edges,
                                                 bool allow_single_wing) const {
    bool pathological_edges = false;

    std::multimap<std::pair<int, int>, int> edge_map;

    for (int it = 0; it < this->m_face_v_indices.size(); ++it) {
        // edges = pairs of vertexes indexes
        std::pair<int, int> medgeA(this->m_face_v_indices[it].x(), this->m_face_v_indices[it].y());
        std::pair<int, int> medgeB(this->m_face_v_indices[it].y(), this->m_face_v_indices[it].z());
        std::pair<int, int> medgeC(this->m_face_v_indices[it].z(), this->m_face_v_indices[it].x());
        // vertex indexes in edges: always in increasing order to avoid ambiguous duplicated edges
        if (medgeA.first > medgeA.second)
            medgeA = std::pair<int, int>(medgeA.second, medgeA.first);
        if (medgeB.first > medgeB.second)
            medgeB = std::pair<int, int>(medgeB.second, medgeB.first);
        if (medgeC.first > medgeC.second)
            medgeC = std::pair<int, int>(medgeC.second, medgeC.first);
        edge_map.insert({medgeA, it});
        edge_map.insert({medgeB, it});
        edge_map.insert({medgeC, it});
    }

    for (auto aedge = edge_map.begin(); aedge != edge_map.end(); ++aedge) {
        auto ret = edge_map.equal_range(aedge->first);
        int nt = 0;
        std::pair<int, int> wingedge;
        std::pair<int, int> wingtri;
        wingtri.first = -1;
        wingtri.second = -1;
        for (auto fedge = ret.first; fedge != ret.second; ++fedge) {
            if (fedge->second == -1)
                break;
            wingedge.first = fedge->first.first;
            wingedge.second = fedge->first.second;
            if (nt == 0)
                wingtri.first = fedge->second;
            if (nt == 1)
                wingtri.second = fedge->second;
            ++nt;
            if (nt == 2)
                break;
        }
        if ((nt == 2) || ((nt == 1) && allow_single_wing)) {
            winged_edges.insert(
                std::pair<std::pair<int, int>, std::pair<int, int>>(wingedge, wingtri));  // ok found winged edge!
            aedge->second = -1;  // deactivate this way otherwise found again by sister
        }
        if (nt == 3) {
            pathological_edges = true;
            // GetLog() << "Warning: winged edge between "<< wing[0] << " and " << wing[1]  << " shared with more than
            // two triangles.\n";
        }
    }
    return pathological_edges;
}